

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
::advance_past_empty_and_deleted
          (dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
           *this)

{
  bool bVar1;
  bool local_1a;
  bool local_19;
  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *this_local;
  
  while( true ) {
    local_19 = false;
    if (this->pos != this->end) {
      bVar1 = dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
              ::test_empty(this->ht,this);
      local_1a = true;
      if (!bVar1) {
        local_1a = dense_hashtable<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                   ::test_deleted(this->ht,this);
      }
      local_19 = local_1a;
    }
    if (local_19 == false) break;
    this->pos = this->pos + 1;
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while ( pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)) )
      ++pos;
  }